

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

String * __thiscall doctest::String::operator+=(String *this,String *other)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char *newStr;
  String *other_local;
  String *this_local;
  
  if (other->m_str != (char *)0x0) {
    sVar1 = detail::my_strlen(this->m_str);
    sVar2 = detail::my_strlen(other->m_str);
    __dest = (char *)malloc(sVar1 + sVar2 + 1);
    strcpy(__dest,this->m_str);
    sVar1 = detail::my_strlen(this->m_str);
    strcpy(__dest + sVar1,other->m_str);
    free(this->m_str);
    this->m_str = __dest;
  }
  return this;
}

Assistant:

String& String::operator+=(const String& other) {
    using namespace detail;
    if(other.m_str != 0) {
        char* newStr = static_cast<char*>(malloc(my_strlen(m_str) + my_strlen(other.m_str) + 1));
        strcpy(newStr, m_str);
        strcpy(newStr + my_strlen(m_str), other.m_str);
        free(m_str);
        m_str = newStr;
    }
    return *this;
}